

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

MessageProcessingResult __thiscall
helics::FederateState::genericUnspecifiedQueueProcess(FederateState *this,bool busyReturn)

{
  __atomic_flag_data_type _Var1;
  FederateStates FVar2;
  TimeCoordinator *pTVar3;
  MessageProcessingResult MVar4;
  
  do {
    LOCK();
    _Var1 = (this->processing).super___atomic_flag_base._M_i;
    (this->processing).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) {
      MVar4 = processQueue(this);
      if (MVar4 != USER_RETURN) {
        pTVar3 = (this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
        (this->time_granted).internalTimeCode = (pTVar3->time_granted).internalTimeCode;
        (this->allowed_send_time).internalTimeCode =
             (pTVar3->info).outputDelay.internalTimeCode + (pTVar3->time_granted).internalTimeCode;
      }
      goto LAB_0031eb46;
    }
  } while ((((this->queueProcessing)._M_base._M_i & 1U) == 0) &&
          (sched_yield(), ((this->queueProcessing)._M_base._M_i & 1U) == 0));
  MVar4 = BUSY;
  if (!busyReturn) {
    sleeplock(this);
    FVar2 = (this->state)._M_i;
    MVar4 = ERROR_RESULT;
    if (FVar2 != ERRORED) {
      MVar4 = (FVar2 == FINISHED) * '\x03';
    }
LAB_0031eb46:
    LOCK();
    (this->processing).super___atomic_flag_base._M_i = false;
    UNLOCK();
  }
  return MVar4;
}

Assistant:

MessageProcessingResult FederateState::genericUnspecifiedQueueProcess(bool busyReturn)
{
    if (try_lock()) {  // only 1 thread can enter this loop once per federate
        auto ret = processQueue();
        if (ret != MessageProcessingResult::USER_RETURN) {
            time_granted = timeCoord->getGrantedTime();
            allowed_send_time = timeCoord->allowedSendTime();
        }
        unlock();
        return ret;
    }
    // if this is not true then try again the core may have been handling something short so try
    // again
    if (!queueProcessing.load()) {
        std::this_thread::yield();
        if (!queueProcessing.load()) {
            return genericUnspecifiedQueueProcess(busyReturn);
        }
    }
    if (busyReturn) {
        return MessageProcessingResult::BUSY;
    }
    sleeplock();
    MessageProcessingResult ret;
    switch (getState()) {
        case FederateStates::ERRORED:
            ret = MessageProcessingResult::ERROR_RESULT;
            break;
        case FederateStates::FINISHED:
            ret = MessageProcessingResult::HALTED;
            break;
        default:  // everything >= INITIALIZING
            ret = MessageProcessingResult::NEXT_STEP;
            break;
    }
    unlock();
    return ret;
}